

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O2

Node __thiscall Jzon::Node::get(Node *this,string *name)

{
  pointer pcVar1;
  Data *pDVar2;
  __type _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  if ((pcVar1 != (pointer)0x0) && (*(int *)(pcVar1 + 4) == 1)) {
    for (__lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (pcVar1 + 0x28);
        __lhs != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (pcVar1 + 0x30);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &__lhs[1]._M_string_length) {
      _Var3 = std::operator==(__lhs,in_RDX);
      if (_Var3) {
        pDVar2 = (Data *)__lhs[1]._M_dataplus._M_p;
        this->data = pDVar2;
        if (pDVar2 == (Data *)0x0) {
          return (Node)(Data *)this;
        }
        pDVar2->refCount = pDVar2->refCount + 1;
        return (Node)(Data *)this;
      }
    }
  }
  this->data = (Data *)0x0;
  return (Node)(Data *)this;
}

Assistant:

Node Node::get(const std::string &name) const
	{
		if (isObject())
		{
			NamedNodeList &children = data->children;
			for (NamedNodeList::const_iterator it = children.begin(); it != children.end(); ++it)
			{
				if ((*it).first == name)
				{
					return (*it).second;
				}
			}
		}
		return Node(T_INVALID);
	}